

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

FilePath * __thiscall
testing::internal::FilePath::RemoveDirectoryName(FilePath *__return_storage_ptr__,FilePath *this)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  string local_48;
  
  __s = (this->pathname_)._M_dataplus._M_p;
  pcVar1 = strrchr(__s,0x2f);
  if (pcVar1 == (char *)0x0) {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,__s,__s + (this->pathname_)._M_string_length);
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    sVar2 = strlen(pcVar1 + 1);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,pcVar1 + 1,pcVar1 + sVar2 + 1);
    FilePath(__return_storage_ptr__,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveDirectoryName() const {
  const char* const last_sep = FindLastPathSeparator();
  return last_sep ? FilePath(last_sep + 1) : *this;
}